

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::UnpackSnorm2x16CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UnpackSnorm2x16CaseInstance *this)

{
  ostringstream *poVar1;
  uint uVar2;
  ShaderExecutor *pSVar3;
  uint uVar4;
  TestStatus *pTVar5;
  deUint32 dVar6;
  ostream *poVar7;
  ostream *poVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [12];
  float fVar13;
  float fVar14;
  float fVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  void *out;
  deUint32 u32_1;
  deUint32 u32_3;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> outputs;
  void *in;
  deUint32 u32;
  deUint32 u32_2;
  Random rnd;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_258;
  Hex<8UL> local_238;
  UnpackSnorm2x16CaseInstance *local_230;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_218;
  ulong local_200;
  TestStatus *local_1f8;
  ulong local_1f0;
  undefined1 local_1e8 [16];
  TestLog local_1d8 [13];
  ios_base local_170 [264];
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  deRandom local_40;
  
  local_230 = this;
  dVar6 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar6 ^ 0x776002);
  local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_258,(iterator)0x0,(uint *)local_1e8);
  local_1e8._0_4_ = 0x7fff8000;
  if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_258,
               (iterator)
               local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1e8);
  }
  else {
    *local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x7fff8000;
    local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1e8._0_4_ = 0x80007fff;
  if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_258,
               (iterator)
               local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1e8);
  }
  else {
    *local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x80007fff;
    local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1e8._0_4_ = 0xffffffff;
  if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_258,
               (iterator)
               local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1e8);
  }
  else {
    *local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xffffffff;
    local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1e8._0_4_ = 0x1fffe;
  local_1f8 = __return_storage_ptr__;
  if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_258,
               (iterator)
               local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1e8);
  }
  else {
    *local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x1fffe;
    local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar10 = 0x5f;
  do {
    dVar6 = deRandom_getUint32(&local_40);
    local_1e8._0_4_ = dVar6;
    if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_258,
                 (iterator)
                 local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1e8);
    }
    else {
      *local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = dVar6;
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&local_218,
             (long)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  local_1e8._0_8_ = ((local_230->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  local_1e8._0_8_ =
       local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_238.value =
       (deUint64)
       local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (local_230->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar3->_vptr_ShaderExecutor[2])
            (pSVar3,(ulong)((long)local_258.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_258.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,local_1e8,&local_238
             ,0);
  local_200 = (ulong)((long)local_258.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
  uVar9 = 0;
  if (0 < (int)local_200) {
    lVar11 = 0;
    uVar9 = 0;
    do {
      uVar2 = *(pointer)((long)(qpTestLog **)
                               local_258.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar11 * 4);
      fVar13 = (float)((int)uVar2 >> 0x10) / 32767.0;
      auVar12 = ZEXT812(0x3f800000);
      if (fVar13 <= 1.0) {
        auVar12._4_8_ = 0;
        auVar12._0_4_ = fVar13;
      }
      uStack_64 = 0;
      uStack_60 = auVar12._8_4_;
      fVar14 = (float)(-(uint)(fVar13 < -1.0) & 0xbf800000 | ~-(uint)(fVar13 < -1.0) & auVar12._0_4_
                      );
      local_21c = local_218.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].m_data[0];
      local_220 = local_218.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].m_data[1];
      uStack_5c = 0;
      fVar15 = (float)(int)(short)uVar2 / 32767.0;
      fVar13 = 1.0;
      if (fVar15 <= 1.0) {
        fVar13 = fVar15;
      }
      uStack_54 = 0;
      fVar13 = (float)(-(uint)(fVar15 < -1.0) & 0xbf800000 | ~-(uint)(fVar15 < -1.0) & (uint)fVar13)
      ;
      uStack_50 = 0;
      uStack_4c = 0;
      uVar2 = (int)local_220 - (int)fVar14;
      if ((uint)local_220 < (uint)fVar14) {
        uVar2 = -((int)local_220 - (int)fVar14);
      }
      uVar4 = (int)local_21c - (int)fVar13;
      if ((uint)local_21c < (uint)fVar13) {
        uVar4 = -((int)local_21c - (int)fVar13);
      }
      local_68 = fVar14;
      local_58 = fVar13;
      if (1 < (uVar2 | uVar4)) {
        if ((int)uVar9 < 10) {
          local_1e8._0_8_ = ((local_230->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1e8 + 8);
          local_228 = local_220;
          local_224 = local_21c;
          local_1f0 = uVar9;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar1,(int)lVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"  expected unpackSnorm2x16(",0x1b);
          local_238.value =
               (deUint64)
               *(uint *)((long)(qpTestLog **)
                               local_258.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar11 * 4);
          tcu::Format::Hex<8UL>::toStream(&local_238,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") = ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"vec2(",5);
          poVar7 = std::ostream::_M_insert<double>((double)local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," / ",3);
          local_238.value = (deUint64)(uint)fVar13;
          tcu::Format::Hex<8UL>::toStream(&local_238,poVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1e8 + 8),", ",2);
          poVar7 = (ostream *)(local_1e8 + 8);
          poVar8 = std::ostream::_M_insert<double>((double)local_68);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," / ",3);
          local_238.value = (deUint64)(uint)fVar14;
          tcu::Format::Hex<8UL>::toStream(&local_238,poVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", got vec2(",0xb);
          poVar8 = std::ostream::_M_insert<double>((double)local_21c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," / ",3);
          local_238.value = (deUint64)(uint)local_224;
          tcu::Format::Hex<8UL>::toStream(&local_238,poVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar8 = std::ostream::_M_insert<double>((double)local_220);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," / ",3);
          local_238.value = (deUint64)(uint)local_228;
          tcu::Format::Hex<8UL>::toStream(&local_238,poVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n  ULP diffs = (",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"), max diff = ",0xe);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar7);
          std::ios_base::~ios_base(local_170);
          uVar9 = local_1f0;
        }
        else if ((int)uVar9 == 10) {
          local_1e8._0_8_ = ((local_230->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1e8 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1e8 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1e8 + 8));
          std::ios_base::~ios_base(local_170);
        }
        uVar9 = (ulong)((int)uVar9 + 1);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)((ulong)((long)local_258.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_258.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  local_1e8._0_8_ = ((local_230->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  iVar10 = (int)local_200;
  std::ostream::operator<<(poVar1,iVar10 - (int)uVar9);
  pTVar5 = local_1f8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,iVar10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  local_1e8._0_8_ = local_1d8;
  if ((int)uVar9 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Pass","");
    pTVar5->m_code = QP_TEST_RESULT_PASS;
    (pTVar5->m_description)._M_dataplus._M_p = (pointer)&(pTVar5->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar5->m_description,local_1e8._0_8_,
               (long)(qpTestLog **)local_1e8._0_8_ + local_1e8._8_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"Result comparison failed","");
    pTVar5->m_code = QP_TEST_RESULT_FAIL;
    (pTVar5->m_description)._M_dataplus._M_p = (pointer)&(pTVar5->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar5->m_description,local_1e8._0_8_,
               (long)(qpTestLog **)local_1e8._0_8_ + local_1e8._8_8_);
  }
  if ((TestLog *)local_1e8._0_8_ != local_1d8) {
    operator_delete((void *)local_1e8._0_8_,(ulong)((long)&(local_1d8[0].m_log)->flags + 1));
  }
  if (local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((TestLog *)
      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar5;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec2>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deInt16	in0			= (deInt16)(deUint16)(inputs[valNdx] & 0xffff);
				const deInt16	in1			= (deInt16)(deUint16)(inputs[valNdx] >> 16);
				const float		ref0		= de::clamp(float(in0) / 32767.f, -1.0f, 1.0f);
				const float		ref1		= de::clamp(float(in1) / 32767.f, -1.0f, 1.0f);
				const float		res0		= outputs[valNdx].x();
				const float		res1		= outputs[valNdx].y();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackSnorm2x16(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec2(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ")"
															   << ", got vec2(" << HexFloat(res0) << ", " << HexFloat(res1) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}